

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

cram_fd * cram_open(char *filename,char *mode)

{
  size_t sVar1;
  hFILE *fp;
  cram_fd *pcVar2;
  char fmode [3];
  char local_1b;
  undefined2 local_1a;
  
  local_1b = *mode;
  local_1a = 0;
  sVar1 = strlen(mode);
  if ((1 < sVar1) && ((mode[1] & 0xfeU) == 0x62)) {
    local_1a = CONCAT11(local_1a._1_1_,0x62);
  }
  fp = hopen(filename,&local_1b);
  if (fp == (hFILE *)0x0) {
    pcVar2 = (cram_fd *)0x0;
  }
  else {
    pcVar2 = cram_dopen(fp,filename,mode);
    if (pcVar2 == (cram_fd *)0x0) {
      hclose_abruptly(fp);
    }
  }
  return pcVar2;
}

Assistant:

cram_fd *cram_open(const char *filename, const char *mode) {
    hFILE *fp;
    cram_fd *fd;
    char fmode[3]= { mode[0], '\0', '\0' };

    if (strlen(mode) > 1 && (mode[1] == 'b' || mode[1] == 'c')) {
	fmode[1] = 'b';
    }

    fp = hopen(filename, fmode);
    if (!fp)
	return NULL;

    fd = cram_dopen(fp, filename, mode);
    if (!fd)
	hclose_abruptly(fp);

    return fd;
}